

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label_test.cpp
# Opt level: O2

void __thiscall
jhu::thrax::LabelTests_PrintHieroReorder_Test::TestBody(LabelTests_PrintHieroReorder_Test *this)

{
  char *in_RCX;
  char *message;
  string_view line;
  AssertHelper AStack_288;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  AlignedSentencePair asp;
  PhrasalRule rule;
  ostringstream s;
  
  line._M_str = in_RCX;
  line._M_len = (size_t)"a c\tb d\t0-0";
  readAlignedSentencePair<false,false>(&asp,(thrax *)0xb,line);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  PhrasalRule::PhrasalRule(&rule,&asp);
  rule.nts._M_elems[0].span.src.start = 0;
  rule.nts._M_elems[0].span.src.end = 1;
  rule.nts._M_elems[0].span.tgt.start = 1;
  rule.nts._M_elems[0].span.tgt.end = 2;
  rule.nts._M_elems[0].label._M_len = 1;
  rule.nts._M_elems[0].label._M_str = "X";
  rule.nts._M_elems[1].span.src.start = 1;
  rule.nts._M_elems[1].span.src.end = 2;
  rule.nts._M_elems[1].span.tgt.start = 0;
  rule.nts._M_elems[1].span.tgt.end = 1;
  rule.nts._M_elems[1].label._M_len = 1;
  rule.nts._M_elems[1].label._M_str = "X";
  thrax::operator<<((ostream *)&s,&rule);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[29],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"[X]\\t[X,1] [X,2]\\t[X,2] [X,1]\\t\"","s.str()",
             (char (*) [29])"[X]\t[X,1] [X,2]\t[X,2] [X,1]\t",&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_270);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_288,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/label_test.cpp"
               ,0x32,message);
    testing::internal::AssertHelper::operator=(&AStack_288,(Message *)&local_270);
    testing::internal::AssertHelper::~AssertHelper(&AStack_288);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_270);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
  AlignedSentencePair::~AlignedSentencePair(&asp);
  return;
}

Assistant:

TEST(LabelTests, PrintHieroReorder) {
  auto asp = readAlignedSentencePair<false, false>("a c\tb d\t0-0");
  std::ostringstream s;
  PhrasalRule rule{asp};
  rule.nts[0] = NT({{0, 1}, {1, 2}}, "X");
  rule.nts[1] = NT({{1, 2}, {0, 1}}, "X");
  auto nt = rule.nts[0].span;
  nt = rule.nts[1].span;
  s << rule;
  EXPECT_EQ("[X]\t[X,1] [X,2]\t[X,2] [X,1]\t", s.str());
}